

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.cpp
# Opt level: O2

IterateResult __thiscall gl3cts::ClipDistance::NegativeTest::iterate(NegativeTest *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  char *description;
  qpTestResult testResult;
  Functions *gl;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar3);
  bVar1 = testClipVertexBuildingErrors(this,gl);
  if (bVar1) {
    bVar1 = testMaxClipDistancesBuildingErrors(this,gl);
  }
  else {
    bVar1 = false;
  }
  bVar2 = testClipDistancesRedeclarationBuildingErrors(this,gl);
  if (bVar1 == false) {
    description = "Fail";
    testResult = QP_TEST_RESULT_FAIL;
  }
  else if (bVar2) {
    description = "Pass";
    testResult = QP_TEST_RESULT_PASS;
  }
  else {
    description = "Pass with warning";
    testResult = QP_TEST_RESULT_QUALITY_WARNING;
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult gl3cts::ClipDistance::NegativeTest::iterate()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Iterate tests */
	bool is_ok	 = true;
	bool may_be_ok = true;

	is_ok	 = is_ok && testClipVertexBuildingErrors(gl);
	is_ok	 = is_ok && testMaxClipDistancesBuildingErrors(gl);
	may_be_ok = may_be_ok && testClipDistancesRedeclarationBuildingErrors(gl);

	/* Result's setup. */
	if (is_ok)
	{
		if (may_be_ok)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_QUALITY_WARNING, "Pass with warning");
		}
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}